

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetOperatorName(InplaceStr name)

{
  bool bVar1;
  InplaceStr local_268;
  InplaceStr local_258;
  InplaceStr local_248;
  InplaceStr local_238;
  InplaceStr local_228;
  InplaceStr local_218;
  InplaceStr local_208;
  InplaceStr local_1f8;
  InplaceStr local_1e8;
  InplaceStr local_1d8;
  InplaceStr local_1c8;
  InplaceStr local_1b8;
  InplaceStr local_1a8;
  InplaceStr local_198;
  InplaceStr local_188;
  InplaceStr local_178;
  InplaceStr local_168;
  InplaceStr local_158;
  InplaceStr local_148;
  InplaceStr local_138;
  InplaceStr local_128;
  InplaceStr local_118;
  InplaceStr local_108;
  InplaceStr local_f8;
  InplaceStr local_e8;
  InplaceStr local_d8;
  InplaceStr local_c8;
  InplaceStr local_b8;
  InplaceStr local_a8;
  InplaceStr local_98;
  InplaceStr local_88;
  InplaceStr local_78;
  InplaceStr local_68;
  InplaceStr local_58;
  InplaceStr local_48;
  InplaceStr local_38;
  undefined1 local_28 [8];
  InplaceStr name_local;
  
  name_local.begin = name.end;
  local_28 = (undefined1  [8])name.begin;
  InplaceStr::InplaceStr(&local_38,"+");
  bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_38);
  if (bVar1) {
    InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorAdd");
  }
  else {
    InplaceStr::InplaceStr(&local_48,"-");
    bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_48);
    if (bVar1) {
      InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorSub");
    }
    else {
      InplaceStr::InplaceStr(&local_58,"*");
      bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_58);
      if (bVar1) {
        InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorMul");
      }
      else {
        InplaceStr::InplaceStr(&local_68,"/");
        bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_68);
        if (bVar1) {
          InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorDiv");
        }
        else {
          InplaceStr::InplaceStr(&local_78,"%");
          bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_78);
          if (bVar1) {
            InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorMod");
          }
          else {
            InplaceStr::InplaceStr(&local_88,"**");
            bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_88);
            if (bVar1) {
              InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorPow");
            }
            else {
              InplaceStr::InplaceStr(&local_98,"<");
              bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_98);
              if (bVar1) {
                InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorLess");
              }
              else {
                InplaceStr::InplaceStr(&local_a8,">");
                bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_a8);
                if (bVar1) {
                  InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorGreater");
                }
                else {
                  InplaceStr::InplaceStr(&local_b8,"<=");
                  bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_b8);
                  if (bVar1) {
                    InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorLEqual");
                  }
                  else {
                    InplaceStr::InplaceStr(&local_c8,">=");
                    bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_c8);
                    if (bVar1) {
                      InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorGEqual");
                    }
                    else {
                      InplaceStr::InplaceStr(&local_d8,"==");
                      bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_d8);
                      if (bVar1) {
                        InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorEqual");
                      }
                      else {
                        InplaceStr::InplaceStr(&local_e8,"!=");
                        bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_e8);
                        if (bVar1) {
                          InplaceStr::InplaceStr((InplaceStr *)&name_local.end,"__operatorNEqual");
                        }
                        else {
                          InplaceStr::InplaceStr(&local_f8,"<<");
                          bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_f8);
                          if (bVar1) {
                            InplaceStr::InplaceStr
                                      ((InplaceStr *)&name_local.end,"__operatorShiftLeft");
                          }
                          else {
                            InplaceStr::InplaceStr(&local_108,">>");
                            bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_108);
                            if (bVar1) {
                              InplaceStr::InplaceStr
                                        ((InplaceStr *)&name_local.end,"__operatorShiftRight");
                            }
                            else {
                              InplaceStr::InplaceStr(&local_118,"&");
                              bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_118);
                              if (bVar1) {
                                InplaceStr::InplaceStr
                                          ((InplaceStr *)&name_local.end,"__operatorBitAnd");
                              }
                              else {
                                InplaceStr::InplaceStr(&local_128,"|");
                                bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_128);
                                if (bVar1) {
                                  InplaceStr::InplaceStr
                                            ((InplaceStr *)&name_local.end,"__operatorBitOr");
                                }
                                else {
                                  InplaceStr::InplaceStr(&local_138,"^");
                                  bVar1 = InplaceStr::operator==((InplaceStr *)local_28,&local_138);
                                  if (bVar1) {
                                    InplaceStr::InplaceStr
                                              ((InplaceStr *)&name_local.end,"__operatorBitXor");
                                  }
                                  else {
                                    InplaceStr::InplaceStr(&local_148,"&&");
                                    bVar1 = InplaceStr::operator==
                                                      ((InplaceStr *)local_28,&local_148);
                                    if (bVar1) {
                                      InplaceStr::InplaceStr
                                                ((InplaceStr *)&name_local.end,"__operatorLogAnd");
                                    }
                                    else {
                                      InplaceStr::InplaceStr(&local_158,"||");
                                      bVar1 = InplaceStr::operator==
                                                        ((InplaceStr *)local_28,&local_158);
                                      if (bVar1) {
                                        InplaceStr::InplaceStr
                                                  ((InplaceStr *)&name_local.end,"__operatorLogOr");
                                      }
                                      else {
                                        InplaceStr::InplaceStr(&local_168,"^^");
                                        bVar1 = InplaceStr::operator==
                                                          ((InplaceStr *)local_28,&local_168);
                                        if (bVar1) {
                                          InplaceStr::InplaceStr
                                                    ((InplaceStr *)&name_local.end,
                                                     "__operatorLogXor");
                                        }
                                        else {
                                          InplaceStr::InplaceStr(&local_178,"=");
                                          bVar1 = InplaceStr::operator==
                                                            ((InplaceStr *)local_28,&local_178);
                                          if (bVar1) {
                                            InplaceStr::InplaceStr
                                                      ((InplaceStr *)&name_local.end,"__operatorSet"
                                                      );
                                          }
                                          else {
                                            InplaceStr::InplaceStr(&local_188,"+=");
                                            bVar1 = InplaceStr::operator==
                                                              ((InplaceStr *)local_28,&local_188);
                                            if (bVar1) {
                                              InplaceStr::InplaceStr
                                                        ((InplaceStr *)&name_local.end,
                                                         "__operatorAddSet");
                                            }
                                            else {
                                              InplaceStr::InplaceStr(&local_198,"-=");
                                              bVar1 = InplaceStr::operator==
                                                                ((InplaceStr *)local_28,&local_198);
                                              if (bVar1) {
                                                InplaceStr::InplaceStr
                                                          ((InplaceStr *)&name_local.end,
                                                           "__operatorSubSet");
                                              }
                                              else {
                                                InplaceStr::InplaceStr(&local_1a8,"*=");
                                                bVar1 = InplaceStr::operator==
                                                                  ((InplaceStr *)local_28,&local_1a8
                                                                  );
                                                if (bVar1) {
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&name_local.end,
                                                             "__operatorMulSet");
                                                }
                                                else {
                                                  InplaceStr::InplaceStr(&local_1b8,"/=");
                                                  bVar1 = InplaceStr::operator==
                                                                    ((InplaceStr *)local_28,
                                                                     &local_1b8);
                                                  if (bVar1) {
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&name_local.end,
                                                               "__operatorDivSet");
                                                  }
                                                  else {
                                                    InplaceStr::InplaceStr(&local_1c8,"**=");
                                                    bVar1 = InplaceStr::operator==
                                                                      ((InplaceStr *)local_28,
                                                                       &local_1c8);
                                                    if (bVar1) {
                                                      InplaceStr::InplaceStr
                                                                ((InplaceStr *)&name_local.end,
                                                                 "__operatorPowSet");
                                                    }
                                                    else {
                                                      InplaceStr::InplaceStr(&local_1d8,"%=");
                                                      bVar1 = InplaceStr::operator==
                                                                        ((InplaceStr *)local_28,
                                                                         &local_1d8);
                                                      if (bVar1) {
                                                        InplaceStr::InplaceStr
                                                                  ((InplaceStr *)&name_local.end,
                                                                   "__operatorModSet");
                                                      }
                                                      else {
                                                        InplaceStr::InplaceStr(&local_1e8,"<<=");
                                                        bVar1 = InplaceStr::operator==
                                                                          ((InplaceStr *)local_28,
                                                                           &local_1e8);
                                                        if (bVar1) {
                                                          InplaceStr::InplaceStr
                                                                    ((InplaceStr *)&name_local.end,
                                                                     "__operatorShlSet");
                                                        }
                                                        else {
                                                          InplaceStr::InplaceStr(&local_1f8,">>=");
                                                          bVar1 = InplaceStr::operator==
                                                                            ((InplaceStr *)local_28,
                                                                             &local_1f8);
                                                          if (bVar1) {
                                                            InplaceStr::InplaceStr
                                                                      ((InplaceStr *)&name_local.end
                                                                       ,"__operatorShrSet");
                                                          }
                                                          else {
                                                            InplaceStr::InplaceStr(&local_208,"&=");
                                                            bVar1 = InplaceStr::operator==
                                                                              ((InplaceStr *)
                                                                               local_28,&local_208);
                                                            if (bVar1) {
                                                              InplaceStr::InplaceStr
                                                                        ((InplaceStr *)
                                                                         &name_local.end,
                                                                         "__operatorAndSet");
                                                            }
                                                            else {
                                                              InplaceStr::InplaceStr
                                                                        (&local_218,"|=");
                                                              bVar1 = InplaceStr::operator==
                                                                                ((InplaceStr *)
                                                                                 local_28,&local_218
                                                                                );
                                                              if (bVar1) {
                                                                InplaceStr::InplaceStr
                                                                          ((InplaceStr *)
                                                                           &name_local.end,
                                                                           "__operatorOrSet");
                                                              }
                                                              else {
                                                                InplaceStr::InplaceStr
                                                                          (&local_228,"^=");
                                                                bVar1 = InplaceStr::operator==
                                                                                  ((InplaceStr *)
                                                                                   local_28,&
                                                  local_228);
                                                  if (bVar1) {
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&name_local.end,
                                                               "__operatorXorSet");
                                                  }
                                                  else {
                                                    InplaceStr::InplaceStr(&local_238,"[]");
                                                    bVar1 = InplaceStr::operator==
                                                                      ((InplaceStr *)local_28,
                                                                       &local_238);
                                                    if (bVar1) {
                                                      InplaceStr::InplaceStr
                                                                ((InplaceStr *)&name_local.end,
                                                                 "__operatorIndex");
                                                    }
                                                    else {
                                                      InplaceStr::InplaceStr(&local_248,"!");
                                                      bVar1 = InplaceStr::operator==
                                                                        ((InplaceStr *)local_28,
                                                                         &local_248);
                                                      if (bVar1) {
                                                        InplaceStr::InplaceStr
                                                                  ((InplaceStr *)&name_local.end,
                                                                   "__operatorLogNot");
                                                      }
                                                      else {
                                                        InplaceStr::InplaceStr(&local_258,"~");
                                                        bVar1 = InplaceStr::operator==
                                                                          ((InplaceStr *)local_28,
                                                                           &local_258);
                                                        if (bVar1) {
                                                          InplaceStr::InplaceStr
                                                                    ((InplaceStr *)&name_local.end,
                                                                     "__operatorBitNot");
                                                        }
                                                        else {
                                                          InplaceStr::InplaceStr(&local_268,"()");
                                                          bVar1 = InplaceStr::operator==
                                                                            ((InplaceStr *)local_28,
                                                                             &local_268);
                                                          if (bVar1) {
                                                            InplaceStr::InplaceStr
                                                                      ((InplaceStr *)&name_local.end
                                                                       ,"__operatorFuncCall");
                                                          }
                                                          else {
                                                            InplaceStr::InplaceStr
                                                                      ((InplaceStr *)&name_local.end
                                                                      );
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

InplaceStr GetOperatorName(InplaceStr name)
{
	if(name == InplaceStr("+"))
		return InplaceStr("__operatorAdd");

	if(name == InplaceStr("-"))
		return InplaceStr("__operatorSub");

	if(name == InplaceStr("*"))
		return InplaceStr("__operatorMul");

	if(name == InplaceStr("/"))
		return InplaceStr("__operatorDiv");

	if(name == InplaceStr("%"))
		return InplaceStr("__operatorMod");

	if(name == InplaceStr("**"))
		return InplaceStr("__operatorPow");

	if(name == InplaceStr("<"))
		return InplaceStr("__operatorLess");

	if(name == InplaceStr(">"))
		return InplaceStr("__operatorGreater");

	if(name == InplaceStr("<="))
		return InplaceStr("__operatorLEqual");

	if(name == InplaceStr(">="))
		return InplaceStr("__operatorGEqual");

	if(name == InplaceStr("=="))
		return InplaceStr("__operatorEqual");

	if(name == InplaceStr("!="))
		return InplaceStr("__operatorNEqual");

	if(name == InplaceStr("<<"))
		return InplaceStr("__operatorShiftLeft");

	if(name == InplaceStr(">>"))
		return InplaceStr("__operatorShiftRight");

	if(name == InplaceStr("&"))
		return InplaceStr("__operatorBitAnd");

	if(name == InplaceStr("|"))
		return InplaceStr("__operatorBitOr");

	if(name == InplaceStr("^"))
		return InplaceStr("__operatorBitXor");

	if(name == InplaceStr("&&"))
		return InplaceStr("__operatorLogAnd");

	if(name == InplaceStr("||"))
		return InplaceStr("__operatorLogOr");

	if(name == InplaceStr("^^"))
		return InplaceStr("__operatorLogXor");

	if(name == InplaceStr("="))
		return InplaceStr("__operatorSet");

	if(name == InplaceStr("+="))
		return InplaceStr("__operatorAddSet");

	if(name == InplaceStr("-="))
		return InplaceStr("__operatorSubSet");

	if(name == InplaceStr("*="))
		return InplaceStr("__operatorMulSet");

	if(name == InplaceStr("/="))
		return InplaceStr("__operatorDivSet");

	if(name == InplaceStr("**="))
		return InplaceStr("__operatorPowSet");

	if(name == InplaceStr("%="))
		return InplaceStr("__operatorModSet");

	if(name == InplaceStr("<<="))
		return InplaceStr("__operatorShlSet");

	if(name == InplaceStr(">>="))
		return InplaceStr("__operatorShrSet");

	if(name == InplaceStr("&="))
		return InplaceStr("__operatorAndSet");

	if(name == InplaceStr("|="))
		return InplaceStr("__operatorOrSet");

	if(name == InplaceStr("^="))
		return InplaceStr("__operatorXorSet");

	if(name == InplaceStr("[]"))
		return InplaceStr("__operatorIndex");

	if(name == InplaceStr("!"))
		return InplaceStr("__operatorLogNot");

	if(name == InplaceStr("~"))
		return InplaceStr("__operatorBitNot");

	if(name == InplaceStr("()"))
		return InplaceStr("__operatorFuncCall");

	return InplaceStr();
}